

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

djg_clock * djgc_create(void)

{
  djg_clock *pdVar1;
  djg_clock *clock;
  
  pdVar1 = (djg_clock *)malloc(0x30);
  (*glad_glGenQueries)(2,pdVar1->queries);
  pdVar1->cpu_ticks = 0.0;
  pdVar1->gpu_ticks = 0.0;
  pdVar1->cpu_start_ticks = 0;
  pdVar1->is_cpu_ticking = 0;
  pdVar1->is_gpu_ticking = 0;
  pdVar1->is_gpu_ready = 1;
  (*glad_glQueryCounter)(pdVar1->queries[0],0x8e28);
  (*glad_glQueryCounter)(pdVar1->queries[1],0x8e28);
  return pdVar1;
}

Assistant:

DJGDEF djg_clock *djgc_create(void)
{
    djg_clock *clock = (djg_clock *)DJG_MALLOC(sizeof(*clock));

    glGenQueries(DJGC__QUERY_COUNT, clock->queries);
    clock->cpu_ticks = 0.0;
    clock->gpu_ticks = 0.0;
    clock->cpu_start_ticks = 0.0;
    clock->is_cpu_ticking = GL_FALSE;
    clock->is_gpu_ticking = GL_FALSE;
    clock->is_gpu_ready = GL_TRUE;
    glQueryCounter(clock->queries[DJGC__QUERY_START], GL_TIMESTAMP);
    glQueryCounter(clock->queries[DJGC__QUERY_STOP], GL_TIMESTAMP);

    return clock;
}